

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis::Mapper::create(Mapper *this)

{
  long in_RSI;
  pointer local_20;
  
  std::
  make_unique<wasm::ModuleUtils::ParallelFunctionAnalysis<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>)::Mapper,wasm::Module&,std::map<wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>>>&,std::function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>&>
            ((Module *)&stack0xffffffffffffffe0,
             *(map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               **)(in_RSI + 0x130),
             *(function<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&)>
               **)(in_RSI + 0x138));
  *(pointer *)this = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }